

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalbackingstore.cpp
# Opt level: O3

void __thiscall
QMinimalBackingStore::flush
          (QMinimalBackingStore *this,QWindow *window,QRegion *region,QPoint *offset)

{
  char *pcVar1;
  int iVar2;
  QTextStream *pQVar3;
  storage_type *psVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QArrayData *local_b0;
  undefined8 *local_a8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  char *local_80;
  QTextStream *local_70;
  QArrayData *local_68;
  longlong lStack_60;
  undefined8 local_58;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->mDebug == true) {
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_68 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
    lStack_60 = -0x5555555555555556;
    QVar5.m_data = (storage_type *)0xc;
    QVar5.m_size = (qsizetype)&local_98;
    QString::fromUtf8(QVar5);
    iVar2 = flush::c;
    local_48.d.d = (Data *)CONCAT44(uStack_94,local_98);
    flush::c = flush::c + 1;
    QString::arg_impl((longlong)&local_68,(int)&local_48,iVar2,(QChar)0x4);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_98 = 2;
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    local_88 = 0;
    uStack_84 = 0;
    local_80 = "default";
    QMessageLogger::debug();
    pQVar3 = local_70;
    QVar6.m_data = (storage_type *)0x30;
    QVar6.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<(pQVar3,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_70[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_70,' ');
    }
    QString::toLocal8Bit_helper((QChar *)&local_b0,lStack_60);
    pQVar3 = local_70;
    if (local_a8 == (undefined8 *)0x0) {
      local_a8 = &QByteArray::_empty;
    }
    psVar4 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar4 + (long)local_a8 + 1;
      psVar4 = psVar4 + 1;
    } while (*pcVar1 != '\0');
    QVar7.m_data = psVar4;
    QVar7.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(pQVar3,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_70[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_70,' ');
    }
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0,1,0x10);
      }
    }
    QDebug::~QDebug((QDebug *)&local_70);
    QImage::save((QString *)&this->mImage,(char *)&local_68,0);
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMinimalBackingStore::flush(QWindow *window, const QRegion &region, const QPoint &offset)
{
    Q_UNUSED(window);
    Q_UNUSED(region);
    Q_UNUSED(offset);

    if (mDebug) {
        static int c = 0;
        QString filename = QString("output%1.png").arg(c++, 4, 10, QChar(u'0'));
        qDebug() << "QMinimalBackingStore::flush() saving contents to" << filename.toLocal8Bit().constData();
        mImage.save(filename);
    }
}